

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

int rtr_mgr_add_group(rtr_mgr_config *config,rtr_mgr_group *group)

{
  long lVar1;
  long lVar2;
  tommy_node *node_00;
  rtr_mgr_group *group_00;
  long in_FS_OFFSET;
  rtr_mgr_group *best_group;
  tommy_node *node;
  rtr_mgr_group_node *gnode;
  rtr_mgr_group *new_group;
  rtr_mgr_group_node *new_group_node;
  rtr_rtvals err_code;
  rtr_interval_mode iv_mode;
  uint expire_iv;
  uint retry_iv;
  uint refresh_iv;
  rtr_mgr_group *group_local;
  rtr_mgr_config *config_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  expire_iv = 0xe10;
  iv_mode = 600;
  err_code = 0x1c20;
  new_group_node._4_4_ = -1;
  gnode = (rtr_mgr_group_node *)0x0;
  pthread_rwlock_wrlock((pthread_rwlock_t *)&config->mutex);
  for (best_group = (rtr_mgr_group *)tommy_list_head(&config->groups->list);
      best_group != (rtr_mgr_group *)0x0; best_group = (rtr_mgr_group *)best_group->sockets) {
    lVar2 = *(long *)&best_group->status;
    if (*(uint8_t *)(*(long *)(lVar2 + 0x20) + 0xc) == group->preference) {
      lrtr_dbg("RTR_MGR: Group with preference value already exists!");
      new_group_node._4_4_ = -2;
      goto LAB_00106de0;
    }
    if (*(int *)(*(long *)**(undefined8 **)(lVar2 + 0x20) + 8) != 0) {
      expire_iv = *(uint *)(*(long *)**(undefined8 **)(lVar2 + 0x20) + 8);
    }
    if (*(int *)(*(long *)**(undefined8 **)(lVar2 + 0x20) + 0x1c) != 0) {
      iv_mode = *(rtr_interval_mode *)(*(long *)**(undefined8 **)(lVar2 + 0x20) + 0x1c);
    }
    if (*(int *)(*(long *)**(undefined8 **)(lVar2 + 0x20) + 0x18) != 0) {
      err_code = *(rtr_rtvals *)(*(long *)**(undefined8 **)(lVar2 + 0x20) + 0x18);
    }
  }
  gnode = (rtr_mgr_group_node *)lrtr_malloc(0x18);
  if (gnode != (rtr_mgr_group_node *)0x0) {
    (gnode->node).next = (tommy_node_struct *)group->sockets;
    (gnode->node).prev = *(tommy_node_struct **)&group->sockets_len;
    (gnode->node).data = *(void **)&group->status;
    *(rtr_mgr_status *)&(gnode->node).data = RTR_MGR_CLOSED;
    new_group_node._4_4_ =
         rtr_mgr_init_sockets
                   ((rtr_mgr_group *)gnode,config,expire_iv,err_code,iv_mode,
                    RTR_INTERVAL_MODE_DEFAULT_MIN_MAX);
    if ((new_group_node._4_4_ == 0) &&
       (node_00 = (tommy_node *)lrtr_malloc(0x28), node_00 != (tommy_node *)0x0)) {
      node_00[1].next = (tommy_node_struct *)gnode;
      tommy_list_insert_tail(&config->groups->list,node_00,node_00);
      config->len = config->len + 1;
      lrtr_dbg("RTR_MGR: Group with preference %d successfully added!",
               (ulong)*(uint8_t *)((long)&(gnode->node).prev + 4));
      tommy_list_sort(&config->groups->list,rtr_mgr_config_cmp_tommy);
      group_00 = rtr_mgr_get_first_group(config);
      if (group_00->status == RTR_MGR_CLOSED) {
        rtr_mgr_start_sockets(group_00);
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
      config_local._4_4_ = 0;
      goto LAB_00106e03;
    }
  }
LAB_00106de0:
  pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
  if (gnode != (rtr_mgr_group_node *)0x0) {
    lrtr_free(gnode);
  }
  config_local._4_4_ = new_group_node._4_4_;
LAB_00106e03:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return config_local._4_4_;
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_add_group(struct rtr_mgr_config *config, const struct rtr_mgr_group *group)
{
	unsigned int refresh_iv = 3600;
	unsigned int retry_iv = 600;
	unsigned int expire_iv = 7200;
	enum rtr_interval_mode iv_mode = RTR_INTERVAL_MODE_DEFAULT_MIN_MAX;
	enum rtr_rtvals err_code = RTR_ERROR;
	struct rtr_mgr_group_node *new_group_node = NULL;
	struct rtr_mgr_group *new_group = NULL;
	struct rtr_mgr_group_node *gnode;

	pthread_rwlock_wrlock(&config->mutex);

	tommy_node *node = tommy_list_head(&config->groups->list);

	while (node) {
		gnode = node->data;
		if (gnode->group->preference == group->preference) {
			MGR_DBG1("Group with preference value already exists!");
			err_code = RTR_INVALID_PARAM;
			goto err;
		}

		// TODO: This is not pretty. It wants to get the same intervals
		// that are being used by other groups. Maybe intervals should
		// be store globally/per-group/per-socket?
		if (gnode->group->sockets[0]->refresh_interval)
			refresh_iv = gnode->group->sockets[0]->refresh_interval;
		if (gnode->group->sockets[0]->retry_interval)
			retry_iv = gnode->group->sockets[0]->retry_interval;
		if (gnode->group->sockets[0]->expire_interval)
			expire_iv = gnode->group->sockets[0]->expire_interval;
		node = node->next;
	}
	new_group = lrtr_malloc(sizeof(struct rtr_mgr_group));

	if (!new_group)
		goto err;

	memcpy(new_group, group, sizeof(struct rtr_mgr_group));
	new_group->status = RTR_MGR_CLOSED;

	err_code = rtr_mgr_init_sockets(new_group, config, refresh_iv, expire_iv, retry_iv, iv_mode);
	if (err_code)
		goto err;

	new_group_node = lrtr_malloc(sizeof(struct rtr_mgr_group_node));
	if (!new_group_node)
		goto err;

	new_group_node->group = new_group;
	tommy_list_insert_tail(&config->groups->list, &new_group_node->node, new_group_node);
	config->len++;

	MGR_DBG("Group with preference %d successfully added!", new_group->preference);

	tommy_list_sort(&config->groups->list, &rtr_mgr_config_cmp_tommy);

	struct rtr_mgr_group *best_group = rtr_mgr_get_first_group(config);

	if (best_group->status == RTR_MGR_CLOSED)
		rtr_mgr_start_sockets(best_group);

	pthread_rwlock_unlock(&config->mutex);
	return RTR_SUCCESS;

err:
	pthread_rwlock_unlock(&config->mutex);

	if (new_group)
		lrtr_free(new_group);

	return err_code;
}